

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall
cmFileListGeneratorFixed::cmFileListGeneratorFixed
          (cmFileListGeneratorFixed *this,cmFileListGeneratorFixed *r)

{
  (this->super_cmFileListGeneratorBase).Next.x_ = (cmFileListGeneratorBase *)0x0;
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase =
       (_func_int **)&PTR__cmFileListGeneratorFixed_005800d8;
  std::__cxx11::string::string((string *)&this->String,(string *)&r->String);
  return;
}

Assistant:

cmFileListGeneratorFixed(cmFileListGeneratorFixed const& r):
    cmFileListGeneratorBase(), String(r.String) {}